

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_bitmap_equals(roaring_bitmap_t *r1,roaring_bitmap_t *r2)

{
  uint uVar1;
  byte *pbVar2;
  undefined1 uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  long *plVar7;
  int i;
  
  uVar1 = (r1->high_low_container).size;
  if (uVar1 == (r2->high_low_container).size) {
    if ((int)uVar1 < 1) {
      return true;
    }
    uVar6 = 0;
    while ((r1->high_low_container).keys[uVar6] == (r2->high_low_container).keys[uVar6]) {
      uVar6 = uVar6 + 1;
      if (uVar1 == uVar6) {
        bVar4 = *(r1->high_low_container).typecodes;
        if (bVar4 == 4) {
          bVar4 = *(byte *)((long)*(r1->high_low_container).containers + 8);
        }
        pbVar2 = (r2->high_low_container).typecodes;
        plVar7 = (long *)*(r2->high_low_container).containers;
        bVar5 = *pbVar2;
        if (bVar5 == 4) {
          bVar5 = *(byte *)(plVar7 + 1);
          plVar7 = (long *)*plVar7;
        }
        uVar3 = (*(code *)(&DAT_0012564c +
                          *(int *)(&DAT_0012564c + (ulong)(((uint)bVar5 + (uint)bVar4 * 4) - 5) * 4)
                          ))(pbVar2,plVar7,bVar5,
                             &DAT_0012564c +
                             *(int *)(&DAT_0012564c +
                                     (ulong)(((uint)bVar5 + (uint)bVar4 * 4) - 5) * 4));
        return (_Bool)uVar3;
      }
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_equals(const roaring_bitmap_t *r1,
                           const roaring_bitmap_t *r2) {
    const roaring_array_t *ra1 = &r1->high_low_container;
    const roaring_array_t *ra2 = &r2->high_low_container;

    if (ra1->size != ra2->size) {
        return false;
    }
    for (int i = 0; i < ra1->size; ++i) {
        if (ra1->keys[i] != ra2->keys[i]) {
            return false;
        }
    }
    for (int i = 0; i < ra1->size; ++i) {
        bool areequal = container_equals(ra1->containers[i], ra1->typecodes[i],
                                         ra2->containers[i], ra2->typecodes[i]);
        if (!areequal) {
            return false;
        }
    }
    return true;
}